

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Offset *this;
  Result RVar1;
  int iVar2;
  Enum EVar3;
  char *format;
  undefined1 local_118 [8];
  BinaryReader reader;
  uint32_t magic;
  
  reader.state_.size = 0;
  this = &reader.state_.offset;
  local_118 = (undefined1  [8])size;
  reader.read_end_ = (size_t)data;
  reader.state_.data = (uint8_t *)size;
  BinaryReaderLogging::BinaryReaderLogging((BinaryReaderLogging *)this,options->log_stream,delegate)
  ;
  reader.logging_delegate_._32_8_ = this;
  if (options->log_stream == (Stream *)0x0) {
    reader.logging_delegate_._32_8_ = delegate;
  }
  reader.delegate_ = (BinaryReaderDelegate *)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reader.options_._0_4_ = 0xc;
  reader.options_._4_2_ = 0;
  reader.last_known_section_ = Custom;
  reader.did_read_names_section_ = false;
  reader.reading_custom_section_ = false;
  reader._166_2_ = 0;
  reader.num_signatures_ = 0;
  reader.num_imports_ = 0;
  reader.num_func_imports_ = 0;
  reader.num_table_imports_ = 0;
  reader.num_memory_imports_ = 0;
  reader.num_global_imports_ = 0;
  reader.num_exception_imports_ = 0;
  reader.num_function_signatures_ = 0;
  reader.num_tables_ = 0;
  reader.num_memories_ = 0;
  reader.num_globals_ = 0;
  reader.num_exports_ = 0;
  reader.target_depths_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)options;
  (*delegate->_vptr_BinaryReaderDelegate[3])(delegate,&reader);
  reader.num_function_bodies_ = 0;
  RVar1 = anon_unknown_19::BinaryReader::ReadT<unsigned_int>
                    ((BinaryReader *)local_118,&reader.num_function_bodies_,"uint32_t","magic");
  EVar3 = Error;
  if (RVar1.enum_ != Error) {
    if (reader.num_function_bodies_ == 0x6d736100) {
      reader.num_exceptions_ = 0;
      RVar1 = anon_unknown_19::BinaryReader::ReadT<unsigned_int>
                        ((BinaryReader *)local_118,&reader.num_exceptions_,"uint32_t","version");
      if (RVar1.enum_ != Error) {
        if (reader.num_exceptions_ == 1) {
          iVar2 = (**(code **)(*(long *)reader.logging_delegate_._32_8_ + 0x20))
                            (reader.logging_delegate_._32_8_,1);
          if (iVar2 == 0) {
            RVar1 = anon_unknown_19::BinaryReader::ReadSections((BinaryReader *)local_118);
            if (RVar1.enum_ == Error) goto LAB_00f29c9f;
            if (reader.num_global_imports_ == reader.num_globals_) {
              iVar2 = (**(code **)(*(long *)reader.logging_delegate_._32_8_ + 0x28))();
              if (iVar2 == 0) {
                EVar3 = Ok;
                goto LAB_00f29c9f;
              }
              format = "EndModule callback failed";
            }
            else {
              format = "function signature count != function body count";
            }
          }
          else {
            format = "BeginModule callback failed";
          }
          anon_unknown_19::BinaryReader::PrintError((BinaryReader *)local_118,format);
        }
        else {
          anon_unknown_19::BinaryReader::PrintError
                    ((BinaryReader *)local_118,"bad wasm file version: %#x (expected %#x)",
                     (ulong)reader.num_exceptions_,1);
        }
      }
    }
    else {
      anon_unknown_19::BinaryReader::PrintError((BinaryReader *)local_118,"bad magic value");
    }
  }
LAB_00f29c9f:
  if (reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(reader.result_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(reader.param_types_.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (reader.delegate_ != (BinaryReaderDelegate *)0x0) {
    operator_delete(reader.delegate_);
  }
  return (Result)EVar3;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule();
}